

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_WaitForFrames(PaAlsaStream *self,unsigned_long *framesAvail,int *xrunOccurred)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  unsigned_long local_88;
  int local_74;
  int local_70;
  uint local_6c;
  int playbackReady;
  int captureReady;
  pollfd *playbackPfds;
  pollfd *capturePfds;
  int totalFds;
  int pollResults;
  int timeouts;
  int xrun;
  int pollTimeout;
  int pollCapture;
  int pollPlayback;
  PaError result;
  int *xrunOccurred_local;
  unsigned_long *framesAvail_local;
  PaAlsaStream *self_local;
  
  pollCapture = 0;
  pollTimeout = (int)((self->playback).pcm != (snd_pcm_t *)0x0);
  xrun = (int)((self->capture).pcm != (snd_pcm_t *)0x0);
  timeouts = self->pollTimeout;
  pollResults = 0;
  totalFds = 0;
  _pollPlayback = xrunOccurred;
  xrunOccurred_local = (int *)framesAvail;
  framesAvail_local = (unsigned_long *)self;
  if (self == (PaAlsaStream *)0x0) {
    __assert_fail("self",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xeb1,
                  "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
  }
  if (framesAvail == (unsigned_long *)0x0) {
    __assert_fail("framesAvail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xeb2,
                  "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
  }
  if (self->callbackMode == 0) {
    paUtilErr_ = PaAlsaStream_GetAvailableFrames
                           (self,(uint)((self->capture).pcm != (snd_pcm_t *)0x0),
                            (uint)((self->playback).pcm != (snd_pcm_t *)0x0),framesAvail,
                            &pollResults);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3768\n"
                       );
      pollCapture = paUtilErr_;
      goto LAB_00112cd5;
    }
    if (pollResults != 0) goto LAB_00112cd5;
    if (*(long *)xrunOccurred_local != 0) {
      if (framesAvail_local[0x58] != 0) {
        *(undefined4 *)(framesAvail_local + 0x5c) = 1;
      }
      if (framesAvail_local[0x68] != 0) {
        *(undefined4 *)(framesAvail_local + 0x6c) = 1;
      }
      goto LAB_00112cd5;
    }
  }
LAB_00112710:
  do {
    if (pollTimeout == 0 && xrun == 0) {
LAB_00112ad5:
      if (pollResults == 0) {
        if (framesAvail_local[0x58] == 0) {
          local_70 = 0;
        }
        else {
          local_70 = (int)framesAvail_local[0x5c];
        }
        if (framesAvail_local[0x68] == 0) {
          local_74 = 0;
        }
        else {
          local_74 = (int)framesAvail_local[0x6c];
        }
        paUtilErr_ = PaAlsaStream_GetAvailableFrames
                               ((PaAlsaStream *)framesAvail_local,local_70,local_74,
                                (unsigned_long *)xrunOccurred_local,&pollResults);
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3894\n"
                           );
          pollCapture = paUtilErr_;
        }
        else if ((framesAvail_local[0x58] == 0) || (framesAvail_local[0x68] == 0)) {
          if (framesAvail_local[0x58] == 0) {
            if ((int)framesAvail_local[0x6c] == 0) {
              __assert_fail("self->playback.ready",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                            ,0xf47,
                            "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                           );
            }
          }
          else if ((int)framesAvail_local[0x5c] == 0) {
            __assert_fail("self->capture.ready",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0xf45,
                          "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                         );
          }
        }
        else if (((int)framesAvail_local[0x6c] == 0) && ((int)framesAvail_local[0x4e] == 0)) {
          if ((int)framesAvail_local[0x5c] == 0) {
            __assert_fail("self->capture.ready",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0xf3d,
                          "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                         );
          }
          if (framesAvail_local[0x59] < *(ulong *)xrunOccurred_local) {
            local_88 = framesAvail_local[0x59];
          }
          else {
            local_88 = *(unsigned_long *)xrunOccurred_local;
          }
          PaAlsaStreamComponent_EndProcessing
                    ((PaAlsaStreamComponent *)(framesAvail_local + 0x51),local_88,&pollResults);
          xrunOccurred_local[0] = 0;
          xrunOccurred_local[1] = 0;
          *(undefined4 *)(framesAvail_local + 0x5c) = 0;
        }
      }
      goto LAB_00112cd5;
    }
    capturePfds._0_4_ = 0;
    playbackPfds = (pollfd *)0x0;
    _playbackReady = (pollfd *)0x0;
    pthread_testcancel();
    if (xrun != 0) {
      playbackPfds = (pollfd *)framesAvail_local[0x46];
      paUtilErr_ = PaAlsaStreamComponent_BeginPolling
                             ((PaAlsaStreamComponent *)(framesAvail_local + 0x51),playbackPfds);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3797\n"
                         );
        pollCapture = paUtilErr_;
        goto LAB_00112cd5;
      }
      capturePfds._0_4_ = *(int *)((long)framesAvail_local + 0x2dc);
    }
    if (pollTimeout != 0) {
      if (xrun == 0) {
        local_6c = 0;
      }
      else {
        local_6c = *(uint *)((long)framesAvail_local + 0x2dc);
      }
      _playbackReady = (pollfd *)(framesAvail_local[0x46] + (ulong)local_6c * 8);
      paUtilErr_ = PaAlsaStreamComponent_BeginPolling
                             ((PaAlsaStreamComponent *)(framesAvail_local + 0x61),_playbackReady);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3804\n"
                         );
        pollCapture = paUtilErr_;
        goto LAB_00112cd5;
      }
      capturePfds._0_4_ = *(int *)((long)framesAvail_local + 0x35c) + (int)capturePfds;
    }
    iVar1 = poll((pollfd *)framesAvail_local[0x46],(long)(int)capturePfds,timeouts);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        paUtilErr_ = -0x2702;
        PaUtil_DebugPrint(
                         "Expression \'paInternalError\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3821\n"
                         );
        pollCapture = paUtilErr_;
        goto LAB_00112cd5;
      }
      Pa_Sleep(1);
      goto LAB_00112710;
    }
    if (iVar1 == 0) {
      totalFds = totalFds + 1;
      if (1 < totalFds) {
        Pa_Sleep(1);
      }
      if (0x7ff < totalFds) {
        xrunOccurred_local[0] = 0;
        xrunOccurred_local[1] = 0;
        pollResults = 1;
        goto LAB_00112cd5;
      }
    }
    else if (0 < iVar1) {
      totalFds = 0;
      if ((xrun != 0) &&
         (paUtilErr_ = PaAlsaStreamComponent_EndPolling
                                 ((PaAlsaStreamComponent *)(framesAvail_local + 0x51),playbackPfds,
                                  &xrun,&pollResults), paUtilErr_ < 0)) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3856\n"
                         );
        pollCapture = paUtilErr_;
        goto LAB_00112cd5;
      }
      if ((pollTimeout != 0) &&
         (paUtilErr_ = PaAlsaStreamComponent_EndPolling
                                 ((PaAlsaStreamComponent *)(framesAvail_local + 0x61),_playbackReady
                                  ,&pollTimeout,&pollResults), paUtilErr_ < 0)) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3860\n"
                         );
        pollCapture = paUtilErr_;
        goto LAB_00112cd5;
      }
      if (pollResults != 0) goto LAB_00112ad5;
    }
  } while ((framesAvail_local[0x58] == 0) || (framesAvail_local[0x68] == 0));
  if ((xrun == 0) || (pollTimeout != 0)) {
    if (((pollTimeout != 0) && (xrun == 0)) &&
       (paUtilErr_ = ContinuePoll((PaAlsaStream *)framesAvail_local,StreamDirection_Out,&timeouts,
                                  &pollTimeout), paUtilErr_ < 0)) {
      PaUtil_DebugPrint(
                       "Expression \'ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3880\n"
                       );
      pollCapture = paUtilErr_;
      goto LAB_00112cd5;
    }
    goto LAB_00112710;
  }
  paUtilErr_ = ContinuePoll((PaAlsaStream *)framesAvail_local,StreamDirection_In,&timeouts,&xrun);
  if (-1 < paUtilErr_) goto LAB_00112710;
  PaUtil_DebugPrint(
                   "Expression \'ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3876\n"
                   );
  pollCapture = paUtilErr_;
LAB_00112cd5:
  do {
    if (pollResults == 0) {
      if (*(long *)xrunOccurred_local == 0) goto LAB_00112d9b;
      bVar3 = true;
      if ((int)framesAvail_local[0x5c] == 0) {
        bVar3 = (int)framesAvail_local[0x6c] != 0;
      }
      if (bVar3) goto LAB_00112d9b;
      PaUtil_DebugPrint(
                       "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3927\n"
                       );
      pollCapture = -0x2702;
      goto LAB_00112cd5;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun((PaAlsaStream *)framesAvail_local);
    if (-1 < paUtilErr_) {
      xrunOccurred_local[0] = 0;
      xrunOccurred_local[1] = 0;
LAB_00112d9b:
      *_pollPlayback = pollResults;
      return pollCapture;
    }
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3919\n"
                     );
    pollCapture = paUtilErr_;
  } while( true );
}

Assistant:

static PaError PaAlsaStream_WaitForFrames( PaAlsaStream *self, unsigned long *framesAvail, int *xrunOccurred )
{
    PaError result = paNoError;
    int pollPlayback = self->playback.pcm != NULL, pollCapture = self->capture.pcm != NULL;
    int pollTimeout = self->pollTimeout;
    int xrun = 0, timeouts = 0;
    int pollResults;

    assert( self );
    assert( framesAvail );

    if( !self->callbackMode )
    {
        /* In blocking mode we will only wait if necessary */
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL,
                    framesAvail, &xrun ) );
        if( xrun )
        {
            goto end;
        }

        if( *framesAvail > 0 )
        {
            /* Mark pcms ready from poll */
            if( self->capture.pcm )
                self->capture.ready = 1;
            if( self->playback.pcm )
                self->playback.ready = 1;

            goto end;
        }
    }

    while( pollPlayback || pollCapture )
    {
        int totalFds = 0;
        struct pollfd *capturePfds = NULL, *playbackPfds = NULL;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif
        if( pollCapture )
        {
            capturePfds = self->pfds;
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds ) );
            totalFds += self->capture.nfds;
        }
        if( pollPlayback )
        {
            /* self->pfds is in effect an array of fds; if necessary, index past the capture fds */
            playbackPfds = self->pfds + (pollCapture ? self->capture.nfds : 0);
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds ) );
            totalFds += self->playback.nfds;
        }

        pollResults = poll( self->pfds, totalFds, pollTimeout );

        if( pollResults < 0 )
        {
            /*  XXX: Depend on preprocessor condition? */
            if( errno == EINTR )
            {
                /* gdb */
                Pa_Sleep( 1 ); /* avoid hot loop */
                continue;
            }

            /* TODO: Add macro for checking system calls */
            PA_ENSURE( paInternalError );
        }
        else if( pollResults == 0 )
        {
           /* Suspended, paused or failed device can provide 0 poll results. To avoid deadloop in such situation
            * we simply run counter 'timeouts' which detects 0 poll result and accumulates. As soon as 2048 timouts (around 2 seconds)
            * are achieved we simply fail function with paTimedOut to notify waiting methods that device is not capable
            * of providing audio data anymore and needs some corresponding recovery action.
            * Note that 'timeouts' is reset to 0 if poll() managed to return non 0 results.
            */

            /*PA_DEBUG(( "%s: poll == 0 results, timed out, %d times left\n", __FUNCTION__, 2048 - timeouts ));*/
            ++ timeouts;
            if( timeouts > 1 ) /* sometimes device times out, but normally once, so we do not sleep any time */
            {
                Pa_Sleep( 1 ); /* avoid hot loop */
            }
            /* not else ! */
            if( timeouts >= 2048 ) /* audio device not working, shall return error to notify waiters */
            {
                *framesAvail = 0; /* no frames available for processing */
                xrun = 1; /* try recovering device */

                PA_DEBUG(( "%s: poll timed out\n", __FUNCTION__, timeouts ));
                goto end;/*PA_ENSURE( paTimedOut );*/
            }
        }
        else if( pollResults > 0 )
        {
            /* reset timouts counter */
            timeouts = 0;

            /* check the return status of our pfds */
            if( pollCapture )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun ) );
            }
            if( pollPlayback )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun ) );
            }
            if( xrun )
            {
                break;
            }
        }

        /* @concern FullDuplex If only one of two pcms is ready we may want to compromise between the two.
         * If there is less than half a period's worth of samples left of frames in the other pcm's buffer we will
         * stop polling.
         */
        if( self->capture.pcm && self->playback.pcm )
        {
            if( pollCapture && !pollPlayback )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture ) );
            }
            else if( pollPlayback && !pollCapture )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback ) );
            }
        }
    }

    if( !xrun )
    {
        /* Get the number of available frames for the pcms that are marked ready.
         * @concern FullDuplex If only one direction is marked ready (from poll), the number of frames available for
         * the other direction is returned. Output is normally preferred over capture however, so capture frames may be
         * discarded to avoid overrun unless paNeverDropInput is specified.
         */
        int captureReady = self->capture.pcm ? self->capture.ready : 0,
            playbackReady = self->playback.pcm ? self->playback.ready : 0;
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun ) );

        if( self->capture.pcm && self->playback.pcm )
        {
            if( !self->playback.ready && !self->neverDropInput )
            {
                /* Drop input, a period's worth */
                assert( self->capture.ready );
                PaAlsaStreamComponent_EndProcessing( &self->capture, PA_MIN( self->capture.framesPerPeriod,
                            *framesAvail ), &xrun );
                *framesAvail = 0;
                self->capture.ready = 0;
            }
        }
        else if( self->capture.pcm )
            assert( self->capture.ready );
        else
            assert( self->playback.ready );
    }

end:
error:
    if( xrun )
    {
        /* Recover from the xrun state */
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *framesAvail = 0;
    }
    else
    {
        if( 0 != *framesAvail )
        {
            /* If we're reporting frames eligible for processing, one of the handles better be ready */
            PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );
        }
    }
    *xrunOccurred = xrun;

    return result;
}